

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

Matrix2f __thiscall Matrix2f::inverse(Matrix2f *this,bool *pbIsSingular,float epsilon)

{
  undefined1 auVar1 [16];
  undefined1 *in_RDX;
  float *in_RSI;
  Matrix2f *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  Matrix2f MVar7;
  float reciprocalDeterminant;
  bool isSingular;
  float determinant;
  
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_RSI[3]),ZEXT416((uint)*in_RSI),
                           ZEXT416((uint)-(in_RSI[2] * in_RSI[1])));
  auVar4._0_8_ = (double)auVar1._0_4_;
  auVar4._8_8_ = auVar1._8_8_;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar4 = vpand_avx(auVar4,auVar6);
  dVar5 = auVar4._0_8_;
  if ((double)in_XMM0_Da <= dVar5) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    fVar2 = 1.0 / auVar1._0_4_;
    uVar3 = (ulong)(uint)(in_RSI[3] * fVar2);
    dVar5 = (double)(ulong)(uint)(-in_RSI[2] * fVar2);
    Matrix2f(in_RDI,in_RSI[3] * fVar2,-in_RSI[2] * fVar2,-in_RSI[1] * fVar2,*in_RSI * fVar2);
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    uVar3 = 0;
    Matrix2f(in_RDI,0.0);
  }
  MVar7.m_elements._8_8_ = dVar5;
  MVar7.m_elements[0] = (float)(int)uVar3;
  MVar7.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Matrix2f)MVar7.m_elements;
}

Assistant:

Matrix2f Matrix2f::inverse( bool* pbIsSingular, float epsilon )
{
	float determinant = m_elements[ 0 ] * m_elements[ 3 ] - m_elements[ 2 ] * m_elements[ 1 ];

	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix2f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix2f
		(
			m_elements[ 3 ] * reciprocalDeterminant, -m_elements[ 2 ] * reciprocalDeterminant,
			-m_elements[ 1 ] * reciprocalDeterminant, m_elements[ 0 ] * reciprocalDeterminant
		);
	}
}